

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::ComputeInternalForces
          (ChElementHexaANCF_3813_9 *this,ChVectorDynamic<> *Fi)

{
  ChMatrixNM<double,_11,_3> *d;
  double *pdVar1;
  ulong uVar2;
  ActualDstType actualDst;
  Index row;
  long lVar3;
  undefined1 auVar4 [64];
  Brick9_Force formula;
  ChVectorN<double,_33> result;
  ChIntegrable3D<Eigen::Matrix<double,_33,_1,_0,_33,_1>_> local_410;
  Transpose<Eigen::Matrix<double,_11,_3,_1,_11,_3>_> local_408;
  Scalar local_400;
  Matrix<double,_11,_11,_0,_11,_11> local_3f8;
  
  d = &this->m_d;
  CalcCoordMatrix(this,d);
  CalcCoordDerivMatrix(this,&this->m_d_dt);
  lVar3 = 0;
  local_410._vptr_ChIntegrable3D = (_func_int **)d;
  local_408.m_matrix = d;
  memset(&local_3f8,0,0x3c8);
  local_400 = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,11,3,1,11,3>,Eigen::Transpose<Eigen::Matrix<double,11,3,1,11,3>>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,11,11,0,11,11>>(&local_3f8,d,&local_408,&local_400);
  pdVar1 = (this->m_ddT).super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_1,_11,_11>_>.m_storage.
           m_data.array + 10;
  do {
    ((plain_array<double,_121,_1,_0> *)(pdVar1 + -10))->array[0] =
         local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data
         .array[lVar3];
    pdVar1[-9] = local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.
                 m_storage.m_data.array[lVar3 + 0xb];
    pdVar1[-8] = local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.
                 m_storage.m_data.array[lVar3 + 0x16];
    pdVar1[-7] = local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.
                 m_storage.m_data.array[lVar3 + 0x21];
    pdVar1[-6] = local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.
                 m_storage.m_data.array[lVar3 + 0x2c];
    pdVar1[-5] = local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.
                 m_storage.m_data.array[lVar3 + 0x37];
    pdVar1[-4] = local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.
                 m_storage.m_data.array[lVar3 + 0x42];
    pdVar1[-3] = local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.
                 m_storage.m_data.array[lVar3 + 0x4d];
    pdVar1[-2] = local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.
                 m_storage.m_data.array[lVar3 + 0x58];
    pdVar1[-1] = local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.
                 m_storage.m_data.array[lVar3 + 99];
    *pdVar1 = local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.
              m_data.array[lVar3 + 0x6e];
    lVar3 = lVar3 + 1;
    pdVar1 = pdVar1 + 0xb;
  } while (lVar3 != 0xb);
  lVar3 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (-1 < lVar3) {
    if (lVar3 != 0) {
      memset((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,0
             ,lVar3 << 3);
    }
    this->m_InteCounter = 0;
    local_410._vptr_ChIntegrable3D = (_func_int **)&PTR__ChIntegrable3D_00b5dc88;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[0x18] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[0x19] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[0x1a] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[0x1b] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[0x1c] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[0x1d] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[0x1e] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[0x1f] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[0x10] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[0x11] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[0x12] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[0x13] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[0x14] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[0x15] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[0x16] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[0x17] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[8] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[9] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[10] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[0xb] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[0xc] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[0xd] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[0xe] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[0xf] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[0] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[1] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[2] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[3] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[4] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[5] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[6] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[7] = 0.0;
    local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.m_storage.m_data.
    array[0x20] = 0.0;
    local_408.m_matrix = (non_const_type)this;
    ChQuadrature::Integrate3D<Eigen::Matrix<double,33,1,0,33,1>>
              ((Matrix<double,_33,_1,_0,_33,_1> *)&local_3f8,&local_410,-1.0,1.0,-1.0,1.0,-1.0,1.0,2
              );
    if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows ==
        0x21) {
      pdVar1 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      uVar2 = 0xfffffffffffffff8;
      do {
        auVar4 = vsubpd_avx512f(*(undefined1 (*) [64])(pdVar1 + uVar2 + 8),
                                *(undefined1 (*) [64])
                                 (local_3f8.
                                  super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.
                                  m_storage.m_data.array + uVar2 + 8));
        *(undefined1 (*) [64])(pdVar1 + uVar2 + 8) = auVar4;
        uVar2 = uVar2 + 8;
      } while (uVar2 < 0x18);
      pdVar1[0x20] = pdVar1[0x20] -
                     local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>.
                     m_storage.m_data.array[0x20];
      return;
    }
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, 33, 1>, Functor = Eigen::internal::sub_assign_op<double, double>]"
                 );
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

void ChElementHexaANCF_3813_9::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    CalcCoordMatrix(m_d);
    CalcCoordDerivMatrix(m_d_dt);
    m_ddT = m_d * m_d.transpose();

    Fi.setZero();
    // Set plastic counter to zero. This runs for each integration point
    m_InteCounter = 0;
    Brick9_Force formula(this);
    ChVectorN<double, 33> result;
    result.setZero();
    ChQuadrature::Integrate3D<ChVectorN<double, 33>>(result,   // result of integration
                                                     formula,  // integrand formula
                                                     -1, 1,    // x limits
                                                     -1, 1,    // y limits
                                                     -1, 1,    // z limits
                                                     2         // order of integration
    );
    Fi -= result;
}